

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O1

void serialization_pipeline<ExtIsoForest,std::ostream>
               (ExtIsoForest *model,basic_ostream<char,_std::char_traits<char>_> *out)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint8_t ending_type;
  uint8_t model_type;
  SignalSwitcher ss;
  size_t jump_ahead;
  size_t size_model;
  undefined1 local_4a;
  undefined1 local_49;
  SignalSwitcher local_48;
  undefined8 local_38;
  size_t local_30;
  
  SignalSwitcher::SignalSwitcher(&local_48);
  auVar1 = std::ostream::tellp();
  add_setup_info<std::ostream>(out,false);
  local_49 = 2;
  write_bytes<unsigned_char>(&local_49,1,out);
  local_30 = get_size_model(model);
  write_bytes<unsigned_long>(&local_30,1,out);
  serialize_model<std::ostream>(model,out);
  check_interrupt_switch(&local_48);
  local_4a = 0;
  write_bytes<unsigned_char>(&local_4a,1,out);
  local_38 = 0;
  write_bytes<unsigned_long>(&local_38,1,out);
  auVar2 = std::ostream::tellp();
  std::ostream::seekp(out,auVar1._0_8_,auVar1._8_8_);
  write_bytes<unsigned_char>(watermark,0xd,out);
  std::ostream::seekp(out,auVar2._0_8_,auVar2._8_8_);
  SignalSwitcher::~SignalSwitcher(&local_48);
  return;
}

Assistant:

void serialization_pipeline(const Model &model, otype &out)
{
    SignalSwitcher ss = SignalSwitcher();

    auto pos_watermark = set_return_position(out);
    
    add_setup_info(out, false);
    uint8_t model_type = get_model_code(model);
    write_bytes<uint8_t>((void*)&model_type, (size_t)1, out);
    size_t size_model = get_size_model(model);
    write_bytes<size_t>((void*)&size_model, (size_t)1, out);
    serialize_model(model, out);
    check_interrupt_switch(ss);

    /* This last bit will be left open in order to signal if anything follows,
       in case it's decided to change the format in the future or to add
       something additional, along with a 'size_t' slot in case it would need
       to jump ahead or something like that. */
    uint8_t ending_type = (uint8_t)EndsHere;
    write_bytes<uint8_t>((void*)&ending_type, (size_t)1, out);
    size_t jump_ahead = 0;
    write_bytes<size_t>((void*)&jump_ahead, (size_t)1, out);

    auto end_pos = set_return_position(out);
    return_to_position(out, pos_watermark);
    add_full_watermark(out);
    return_to_position(out, end_pos);
}